

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

int __thiscall pstore::database::open(database *this,char *__file,int __oflag,...)

{
  bool bVar1;
  __type_conflict _Var2;
  element_type *peVar3;
  int __oflag_00;
  char *__new;
  int __fd;
  string *path;
  bool local_102;
  undefined1 local_100 [32];
  undefined1 local_e0 [40];
  deleter temp_file_deleter;
  undefined1 local_48 [8];
  shared_ptr<pstore::file::file_handle> temporary_file;
  writable_mode write_mode;
  create_mode create_mode;
  access_mode am_local;
  string *path_local;
  shared_ptr<pstore::file::file_handle> *file;
  
  local_102 = __oflag == 1 || __oflag == 2;
  std::make_shared<pstore::file::file_handle,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  peVar3 = std::
           __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  pstore::file::file_handle::open(peVar3,(char *)0x1,local_102,0);
  peVar3 = std::
           __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  bVar1 = pstore::file::file_handle::is_open(peVar3);
  if (bVar1) {
LAB_00110419:
    return (int)this;
  }
  if (__oflag != 1) {
    raise<std::errc,std::__cxx11::string>
              (no_such_file_or_directory,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__file);
  }
  std::make_shared<pstore::file::file_handle>();
  peVar3 = std::
           __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
  pstore::path::dir_name((path *)&temp_file_deleter.super_deleter_base.released_,(string *)__file);
  pstore::file::file_handle::open(peVar3,&temp_file_deleter.super_deleter_base.released_,__oflag_00)
  ;
  std::__cxx11::string::~string((string *)&temp_file_deleter.super_deleter_base.released_);
  std::__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_48);
  pstore::file::file_handle::path_abi_cxx11_((file_handle *)local_e0);
  path = (string *)local_e0;
  pstore::file::posix::deleter::deleter((deleter *)(local_e0 + 0x20),path);
  __fd = (int)path;
  std::__cxx11::string::~string((string *)local_e0);
  peVar3 = std::
           __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_48);
  build_new_store(&peVar3->super_file_base);
  peVar3 = std::
           __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
  pstore::file::file_handle::close(peVar3,__fd);
  peVar3 = std::
           __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
  pstore::file::file_handle::rename(peVar3,__file,__new);
  pstore::file::deleter_base::release((deleter_base *)(local_e0 + 0x20));
  pstore::file::posix::deleter::~deleter((deleter *)(local_e0 + 0x20));
  std::shared_ptr<pstore::file::file_handle>::~shared_ptr
            ((shared_ptr<pstore::file::file_handle> *)local_48);
  peVar3 = std::
           __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  pstore::file::file_handle::open(peVar3,(char *)0x1,local_102);
  peVar3 = std::
           __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  bVar1 = pstore::file::file_handle::is_open(peVar3);
  if (bVar1) {
    std::__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    pstore::file::file_handle::path_abi_cxx11_((file_handle *)local_100);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_100,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __file);
    if (_Var2) {
      std::__cxx11::string::~string((string *)local_100);
      goto LAB_00110419;
    }
  }
  assert_failed("file->is_open () && file->path () == path",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                ,0x12e);
}

Assistant:

auto database::open (std::string const & path, access_mode const am)
        -> std::shared_ptr<file::file_handle> {

        using present_mode = file::file_handle::present_mode;
        auto const create_mode = file::file_handle::create_mode::open_existing;
        auto const write_mode =
            (am == access_mode::writable || am == access_mode::writeable_no_create)
                ? file::file_handle::writable_mode::read_write
                : file::file_handle::writable_mode::read_only;

        auto file = std::make_shared<file::file_handle> (path);
        file->open (create_mode, write_mode, present_mode::allow_not_found);
        if (file->is_open ()) {
            return file;
        }

        if (am != access_mode::writable) {
            raise (std::errc::no_such_file_or_directory, path);
        }

        // We didn't find the file so will have to create a new one.
        //
        // To ensure that this operation is as close to atomic as the host OS allows, we create
        // a temporary file in the same directory but with a random name. (This approach was
        // chosen because this directory most likely has the same permissions and is on the same
        // physical volume as the final file). We then populate that file with the basic data
        // structures and rename it to the final destination.
        {
            auto const temporary_file = std::make_shared<file::file_handle> ();
            temporary_file->open (file::file_handle::unique{}, path::dir_name (path));
            file::deleter temp_file_deleter (temporary_file->path ());
            // Fill the file with its initial contents.
            database::build_new_store (*temporary_file);
            temporary_file->close ();
            temporary_file->rename (path);
            // The temporary file will no longer be found anyway (we just renamed it).
            temp_file_deleter.release ();
        }
        file->open (create_mode, write_mode, file::file_handle::present_mode::must_exist);
        PSTORE_ASSERT (file->is_open () && file->path () == path);
        return file;
    }